

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

void __thiscall cppnet::EpollEventActions::ProcessEvent(EpollEventActions *this,int32_t wait_ms)

{
  int iVar1;
  uint uVar2;
  epoll_event *__events;
  size_type sVar3;
  int *piVar4;
  SingletonLogger *pSVar5;
  uint *puVar6;
  uint32_t *puVar7;
  char *pcVar8;
  id iVar9;
  __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_> local_20
  ;
  short local_16;
  int32_t local_14;
  int16_t ret;
  EpollEventActions *pEStack_10;
  int32_t wait_ms_local;
  EpollEventActions *this_local;
  
  iVar1 = this->_epoll_handler;
  local_14 = wait_ms;
  pEStack_10 = this;
  local_20._M_current =
       (epoll_event *)
       std::vector<epoll_event,_std::allocator<epoll_event>_>::begin(&this->_active_list);
  __events = (epoll_event *)
             __gnu_cxx::
             __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_>
             ::operator*(&local_20);
  sVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->_active_list);
  iVar1 = epoll_wait(iVar1,__events,(int)sVar3,local_14);
  local_16 = (short)iVar1;
  if (local_16 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      pSVar5 = Singleton<cppnet::SingletonLogger>::Instance();
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      puVar7 = (uint32_t *)__errno_location();
      pcVar8 = ErrnoInfo(*puVar7);
      SingletonLogger::Error
                (pSVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x119,"EPOLL wait failed! error:%d, info:%s",(ulong)uVar2,pcVar8);
    }
  }
  else {
    pSVar5 = Singleton<cppnet::SingletonLogger>::Instance();
    uVar2 = (uint)local_16;
    iVar9 = std::this_thread::get_id();
    SingletonLogger::Debug
              (pSVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
               ,0x11c,"EPOLL get events! num:%d, TheadId: %ld",(ulong)uVar2,iVar9._M_thread);
    OnEvent(this,&this->_active_list,local_16);
  }
  return;
}

Assistant:

void EpollEventActions::ProcessEvent(int32_t wait_ms) {
    int16_t ret = epoll_wait(_epoll_handler, &*_active_list.begin(), (int)_active_list.size(), wait_ms);
    if (ret == -1) {
        if (errno == EINTR) {
            return;
        }
        LOG_ERROR("EPOLL wait failed! error:%d, info:%s", errno, ErrnoInfo(errno));

    } else {
        LOG_DEBUG("EPOLL get events! num:%d, TheadId: %ld", ret, std::this_thread::get_id());

        OnEvent(_active_list, ret);
    }
}